

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oss.cpp
# Opt level: O1

int __thiscall anon_unknown.dwarf_273a44::OSScapture::recordProc(OSScapture *this)

{
  uint uVar1;
  ALCdevice *pAVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  uint *puVar7;
  int *piVar8;
  char *pcVar9;
  pollfd pollitem;
  ll_ringbuffer_data_pair vec;
  pollfd local_58;
  ll_ringbuffer_data_pair local_50;
  
  SetRTPriority();
  althrd_setname("alsoft-record");
  pAVar2 = (this->super_BackendBase).mDevice;
  uVar3 = BytesFromDevFmt(pAVar2->FmtType);
  uVar4 = ChannelsFromDevFmt(pAVar2->FmtChans,pAVar2->mAmbiOrder);
  if (((this->mKillNow)._M_base._M_i & 1U) == 0) {
    do {
      local_58.events = 1;
      local_58.fd = this->mFd;
      local_58.revents = 0;
      iVar5 = poll(&local_58,1,1000);
      if (iVar5 < 0) {
        puVar7 = (uint *)__errno_location();
        uVar1 = *puVar7;
        if ((uVar1 != 4) && (uVar1 != 0xb)) {
          if (0 < (int)gLogLevel) {
            _GLOBAL__N_1::OSScapture::recordProc((OSScapture *)(ulong)uVar1);
          }
          pAVar2 = (this->super_BackendBase).mDevice;
          pcVar9 = strerror(*puVar7);
          ALCdevice::handleDisconnect(pAVar2,"Failed to check capture samples: %s",pcVar9);
          return 0;
        }
      }
      else if (iVar5 == 0) {
        if (1 < (int)gLogLevel) {
          _GLOBAL__N_1::OSScapture::recordProc();
        }
      }
      else {
        RingBuffer::getWriteVector
                  (&local_50,
                   (this->mRing)._M_t.
                   super___uniq_ptr_impl<RingBuffer,_std::default_delete<RingBuffer>_>._M_t.
                   super__Tuple_impl<0UL,_RingBuffer_*,_std::default_delete<RingBuffer>_>.
                   super__Head_base<0UL,_RingBuffer_*,_false>._M_head_impl);
        if (local_50.first.len == 0) {
LAB_0016623a:
          iVar5 = 0;
        }
        else {
          uVar6 = read(this->mFd,local_50.first.buf,local_50.first.len * (uVar4 * uVar3));
          if ((long)uVar6 < 0) {
            if (0 < (int)gLogLevel) {
              _GLOBAL__N_1::OSScapture::recordProc();
            }
            pAVar2 = (this->super_BackendBase).mDevice;
            piVar8 = __errno_location();
            pcVar9 = strerror(*piVar8);
            ALCdevice::handleDisconnect(pAVar2,"Failed reading capture samples: %s",pcVar9);
            iVar5 = 3;
          }
          else {
            iVar5 = 0;
            RingBuffer::writeAdvance
                      ((this->mRing)._M_t.
                       super___uniq_ptr_impl<RingBuffer,_std::default_delete<RingBuffer>_>._M_t.
                       super__Tuple_impl<0UL,_RingBuffer_*,_std::default_delete<RingBuffer>_>.
                       super__Head_base<0UL,_RingBuffer_*,_false>._M_head_impl,
                       (uVar6 & 0xffffffff) / (ulong)(uVar4 * uVar3));
          }
          if (-1 < (long)uVar6) goto LAB_0016623a;
        }
        if (iVar5 == 3) {
          return 0;
        }
      }
    } while (((this->mKillNow)._M_base._M_i & 1U) == 0);
  }
  return 0;
}

Assistant:

int OSScapture::recordProc()
{
    SetRTPriority();
    althrd_setname(RECORD_THREAD_NAME);

    const ALuint frame_size{mDevice->frameSizeFromFmt()};
    while(!mKillNow.load(std::memory_order_acquire))
    {
        pollfd pollitem{};
        pollitem.fd = mFd;
        pollitem.events = POLLIN;

        int sret{poll(&pollitem, 1, 1000)};
        if(sret < 0)
        {
            if(errno == EINTR || errno == EAGAIN)
                continue;
            ERR("poll failed: %s\n", strerror(errno));
            mDevice->handleDisconnect("Failed to check capture samples: %s", strerror(errno));
            break;
        }
        else if(sret == 0)
        {
            WARN("poll timeout\n");
            continue;
        }

        auto vec = mRing->getWriteVector();
        if(vec.first.len > 0)
        {
            ssize_t amt{read(mFd, vec.first.buf, vec.first.len*frame_size)};
            if(amt < 0)
            {
                ERR("read failed: %s\n", strerror(errno));
                mDevice->handleDisconnect("Failed reading capture samples: %s", strerror(errno));
                break;
            }
            mRing->writeAdvance(static_cast<ALuint>(amt)/frame_size);
        }
    }

    return 0;
}